

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool chck_buffer_from_pointer(chck_buffer *buf,void *ptr,size_t size,chck_endianess endianess)

{
  if (buf != (chck_buffer *)0x0) {
    buf->step = 0x20;
    buf->endianess = false;
    buf->copied = false;
    *(undefined6 *)&buf->field_0x22 = 0;
    buf->endianess = (endianess & ~CHCK_ENDIANESS_NATIVE) != CHCK_ENDIANESS_LITTLE;
    buf->size = size;
    buf->curpos = (uint8_t *)ptr;
    buf->buffer = (uint8_t *)ptr;
    return true;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x62,
                "_Bool chck_buffer_from_pointer(struct chck_buffer *, void *, size_t, enum chck_endianess)"
               );
}

Assistant:

bool
chck_buffer_from_pointer(struct chck_buffer *buf, void *ptr, size_t size, enum chck_endianess endianess)
{
   assert(buf);
   *buf = (struct chck_buffer){ .step = 32 };
   chck_buffer_set_pointer(buf, ptr, size, endianess);
   return true;
}